

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O0

event_process_result __thiscall
afsm::transitions::
state_transition_table<afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>,_afsm::test::b::inner_dispatch_test,_unsigned_long>
::process_transition_event<afsm::test::b::event_bca>
          (state_transition_table<afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>,_afsm::test::b::inner_dispatch_test,_unsigned_long>
           *this,event_bca *event)

{
  event_process_result eVar1;
  transition_table_type<afsm::test::b::event_bca> *this_00;
  size_t __n;
  const_reference this_01;
  indexes_tuple<0UL,_1UL,_2UL> local_21;
  transition_table_type<afsm::test::b::event_bca> *local_20;
  transition_table_type<afsm::test::b::event_bca> *inv_table;
  event_bca *event_local;
  state_transition_table<afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>,_afsm::test::b::inner_dispatch_test,_unsigned_long>
  *this_local;
  
  inv_table = (transition_table_type<afsm::test::b::event_bca> *)event;
  event_local = (event_bca *)this;
  this_00 = state_transition_table<afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,afsm::test::b::dummy_sm>,afsm::test::b::inner_dispatch_test,unsigned_long>
            ::transition_table<afsm::test::b::event_bca,0ul,1ul,2ul>(&local_21);
  local_20 = this_00;
  __n = current_state(this);
  this_01 = std::
            array<std::function<afsm::actions::event_process_result_(afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>,_afsm::test::b::inner_dispatch_test,_unsigned_long>_&,_afsm::test::b::event_bca_&&)>,_3UL>
            ::operator[](this_00,__n);
  eVar1 = std::
          function<afsm::actions::event_process_result_(afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>,_afsm::test::b::inner_dispatch_test,_unsigned_long>_&,_afsm::test::b::event_bca_&&)>
          ::operator()(this_01,this,(event_bca *)inv_table);
  return eVar1;
}

Assistant:

actions::event_process_result
    process_transition_event(Event&& event)
    {
        auto const& inv_table = transition_table<Event>( state_indexes{} );
        return inv_table[current_state()](*this, ::std::forward<Event>(event));
    }